

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgCong.cpp
# Opt level: O0

ClauseIterator __thiscall Inferences::ArgCong::generateClauses(ArgCong *this,Clause *premise)

{
  ResultFn f;
  bool bVar1;
  int iVar2;
  Options *this_00;
  LiteralSelector *pLVar3;
  Clause *in_RDX;
  long *in_RSI;
  Clause *in_RDI;
  FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  it4;
  MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>
  it3;
  FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>
  it2;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  it1;
  FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *ord;
  FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *this_01;
  Clause *cl;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 uVar4;
  undefined1 uVar5;
  Clause *pCVar6;
  FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *in_stack_fffffffffffffe48;
  undefined1 local_170 [56];
  undefined1 local_138 [200];
  FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *local_70;
  FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *local_68;
  Clause *local_60;
  undefined1 local_58 [40];
  FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *local_30;
  FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  *local_28;
  Clause *local_20;
  
  pCVar6 = in_RDI;
  bVar1 = Kernel::Clause::isEmpty(in_RDX);
  if (bVar1) {
    Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  }
  else {
    Kernel::Clause::getSelectedLiteralIterator
              ((Clause *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    local_70 = local_30;
    local_68 = local_28;
    local_60 = local_20;
    Lib::
    getFilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::ArgCong::IsPositiveEqualityFn>
              (local_58);
    Lib::
    FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>
    ::FilteredIterator((FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>
                        *)local_28,
                       (FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>
                        *)local_30);
    this_00 = (Options *)(**(code **)(*in_RSI + 0x20))();
    bVar1 = Shell::Options::literalMaximalityAftercheck(this_00);
    uVar4 = 0;
    ord = local_30;
    this_01 = local_28;
    cl = local_20;
    if (bVar1) {
      pLVar3 = Saturation::SaturationAlgorithm::getLiteralSelector((SaturationAlgorithm *)0x7288d0);
      iVar2 = (*pLVar3->_vptr_LiteralSelector[2])();
      uVar4 = (undefined1)iVar2;
      ord = local_30;
      this_01 = local_28;
      cl = local_20;
    }
    uVar5 = uVar4;
    Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x7288f3);
    ResultFn::ResultFn((ResultFn *)CONCAT17(uVar4,in_stack_fffffffffffffde0),cl,
                       SUB81((ulong)this_01 >> 0x38,0),(Ordering *)ord);
    f._8_8_ = pCVar6;
    f._cl = in_RDI;
    Lib::
    getMappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::ArgCong::IsPositiveEqualityFn,false>,Inferences::ArgCong::ResultFn>
              ((FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>
                *)CONCAT17(uVar5,in_stack_fffffffffffffe08),f);
    Lib::
    MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>
    ::MappingIterator((MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>
                       *)this_01,
                      (MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>
                       *)ord);
    Lib::
    getFilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::ArgCong::IsPositiveEqualityFn,false>,Inferences::ArgCong::ResultFn,Kernel::Clause*>,Lib::NonzeroFn>
              (local_138,local_170);
    Lib::
    FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
    ::FilteredIterator(this_01,ord);
    Lib::
    pvi<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::ArgCong::IsPositiveEqualityFn,false>,Inferences::ArgCong::ResultFn,Kernel::Clause*>,Lib::NonzeroFn,false>>
              (in_stack_fffffffffffffe48);
    Lib::
    FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
    ::~FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                         *)0x728996);
    Lib::
    FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
    ::~FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                         *)0x7289a3);
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)pCVar6;
}

Assistant:

ClauseIterator ArgCong::generateClauses(Clause* premise)
{
  //cout << "argcong with " + premise->toString() << endl;
  if(premise->isEmpty()) {
    return ClauseIterator::getEmpty();
  }
  ASS(premise->numSelected()>0);

  auto it1 = premise->getSelectedLiteralIterator();

  auto it2 = getFilteredIterator(it1,IsPositiveEqualityFn());

  auto it3 = getMappingIterator(it2,ResultFn(premise,
      getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete(),
      &_salg->getOrdering()));

  auto it4 = getFilteredIterator(it3,NonzeroFn());

  //cout << "out of arg cong" << endl;
  return pvi( it4 );
}